

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O3

void google::anon_unknown_0::DumpStackFrameInfo(char *prefix,void *pc)

{
  char *pcVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  char cVar6;
  char *pcVar7;
  char *pcVar8;
  char *start;
  char *__src;
  size_t __len;
  size_t __n;
  char buf [1024];
  char symbolized [1024];
  char acStack_103e [2030];
  undefined8 uStack_850;
  MinimalFormatter local_840;
  char local_828 [18];
  char acStack_816 [1006];
  char local_428 [1032];
  
  uStack_850 = 0x11781a;
  bVar2 = Symbolize((void *)((long)pc + -1),local_428,0x400);
  pcVar8 = "(unknown)";
  if (bVar2) {
    pcVar8 = local_428;
  }
  local_840.buffer_ = local_828;
  local_840.end_ = local_428;
  cVar6 = *prefix;
  if (cVar6 == '\0') {
    local_828[0] = '@';
    uVar4 = 0;
  }
  else {
    lVar5 = 0;
    uVar4 = 0;
    do {
      uVar3 = uVar4;
      if (uVar3 == 0x400) {
        uVar4 = 0x400;
        goto LAB_001178a8;
      }
      local_828[uVar3] = cVar6;
      cVar6 = prefix[uVar3 + 1];
      uVar4 = uVar3 + 1;
    } while (cVar6 != '\0');
    if (0x3fe < uVar3) {
      lVar5 = 0;
      goto LAB_001178a8;
    }
    local_828[uVar3 + 1] = '@';
    if (uVar4 == 0x3ff) {
      lVar5 = 1;
      uVar4 = 0x3ff;
      goto LAB_001178a8;
    }
  }
  local_828[uVar4 + 1] = ' ';
  lVar5 = 2;
LAB_001178a8:
  uVar4 = uVar4 + lVar5;
  __src = local_828 + uVar4;
  if (uVar4 < 0x400) {
    local_828[uVar4] = '0';
    lVar5 = 1;
    if (uVar4 != 0x3ff) {
      local_828[uVar4 + 1] = 'x';
      lVar5 = 2;
    }
  }
  else {
    lVar5 = 0;
  }
  local_840.cursor_ = __src + lVar5;
  uStack_850 = 0x1178f1;
  MinimalFormatter::AppendUint64(&local_840,(uint64)pc,0x10);
  pcVar1 = acStack_816 + uVar4;
  pcVar7 = local_840.cursor_;
  if (local_840.cursor_ < pcVar1) {
    __n = (long)pcVar1 - (long)local_840.cursor_;
    if ((long)local_840.cursor_ - (long)__src != 0) {
      uStack_850 = 0x117915;
      memmove(__src + __n,__src,(long)local_840.cursor_ - (long)__src);
    }
    uStack_850 = 0x117925;
    memset(__src,0x20,__n);
    pcVar7 = pcVar1;
  }
  bVar2 = pcVar7 < local_840.end_;
  if (bVar2) {
    *pcVar7 = ' ';
  }
  cVar6 = *pcVar8;
  for (lVar5 = 0; (cVar6 != '\0' && (pcVar7 + lVar5 + (ulong)bVar2 < local_840.end_));
      lVar5 = lVar5 + 1) {
    pcVar7[lVar5 + (ulong)bVar2] = cVar6;
    cVar6 = pcVar8[lVar5 + 1];
  }
  pcVar7 = pcVar7 + lVar5 + (ulong)bVar2;
  if (pcVar7 < local_840.end_) {
    *pcVar7 = '\n';
  }
  uStack_850 = 0x117989;
  (*(code *)(anonymous_namespace)::g_failure_writer)
            (local_828,((int)pcVar7 + (uint)(pcVar7 < local_840.end_)) - (int)local_840.buffer_);
  return;
}

Assistant:

void DumpStackFrameInfo(const char* prefix, void* pc) {
  // Get the symbol name.
  const char *symbol = "(unknown)";
  char symbolized[1024];  // Big enough for a sane symbol.
  // Symbolizes the previous address of pc because pc may be in the
  // next function.
  if (Symbolize(reinterpret_cast<char *>(pc) - 1,
                symbolized, sizeof(symbolized))) {
    symbol = symbolized;
  }

  char buf[1024];  // Big enough for stack frame info.
  MinimalFormatter formatter(buf, sizeof(buf));

  formatter.AppendString(prefix);
  formatter.AppendString("@ ");
  const int width = 2 * sizeof(void*) + 2;  // + 2  for "0x".
  formatter.AppendHexWithPadding(reinterpret_cast<uintptr_t>(pc), width);
  formatter.AppendString(" ");
  formatter.AppendString(symbol);
  formatter.AppendString("\n");
  g_failure_writer(buf, formatter.num_bytes_written());
}